

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O3

TypedDeleter<LLVMBC::AtomicRMWInst> * __thiscall
LLVMBC::LLVMContext::
construct_trivial<LLVMBC::LLVMContext::TypedDeleter<LLVMBC::AtomicRMWInst>,LLVMBC::AtomicRMWInst*&>
          (LLVMContext *this,AtomicRMWInst **u)

{
  AtomicRMWInst *pAVar1;
  TypedDeleter<LLVMBC::AtomicRMWInst> *pTVar2;
  
  pTVar2 = (TypedDeleter<LLVMBC::AtomicRMWInst> *)allocate(this,0x10,8);
  if (pTVar2 != (TypedDeleter<LLVMBC::AtomicRMWInst> *)0x0) {
    pAVar1 = *u;
    (pTVar2->super_Deleter)._vptr_Deleter = (_func_int **)&PTR__Deleter_001f36c0;
    pTVar2->ptr = pAVar1;
    return pTVar2;
  }
  std::terminate();
}

Assistant:

T *construct_trivial(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);
		return t;
	}